

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

bool __thiscall pbrt::SampledWavelengths::SecondaryTerminated(SampledWavelengths *this)

{
  float *pfVar1;
  long in_RDI;
  int i;
  int local_14;
  
  local_14 = 1;
  while( true ) {
    if (3 < local_14) {
      return true;
    }
    pfVar1 = pstd::array<float,_4>::operator[]((array<float,_4> *)(in_RDI + 0x10),(long)local_14);
    if ((*pfVar1 != 0.0) || (NAN(*pfVar1))) break;
    local_14 = local_14 + 1;
  }
  return false;
}

Assistant:

PBRT_CPU_GPU
    bool SecondaryTerminated() const {
        for (int i = 1; i < NSpectrumSamples; ++i)
            if (pdf[i] != 0)
                return false;
        return true;
    }